

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

QuadLight * __thiscall
embree::SceneGraph::QuadLight::transform(QuadLight *this,AffineSpace3fa *space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 *in_RDX;
  long in_RSI;
  QuadLight *in_RDI;
  Vec3fa *in_stack_fffffffffffff0f8;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  float *local_e40;
  undefined1 *local_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  float *local_dd0;
  undefined1 *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  float *local_d60;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  float *local_cf0;
  undefined8 *local_ce0;
  float local_cd4;
  undefined8 *local_cd0;
  float local_cc4;
  undefined8 *local_cc0;
  float local_cb4;
  undefined8 *local_cb0;
  float local_ca4;
  undefined8 *local_ca0;
  float local_c94;
  undefined8 *local_c90;
  float local_c84;
  undefined8 *local_c80;
  float local_c74;
  undefined8 *local_c70;
  float local_c64;
  undefined8 *local_c60;
  float local_c54;
  undefined8 *local_c50;
  float local_c44;
  undefined8 *local_c40;
  float local_c34;
  undefined8 *local_c30;
  float local_c24;
  undefined8 *local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 *local_c00;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  undefined8 *local_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  undefined8 *local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 *local_ab0;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  undefined8 *local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 *local_a40;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  undefined8 *local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  undefined8 *local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_960;
  undefined8 *local_950;
  undefined1 *local_948;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined1 *local_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined1 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 *local_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 *local_810;
  undefined8 *local_800;
  undefined1 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined1 *local_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  undefined8 *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_688;
  undefined8 *local_678;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  undefined8 *local_5f8;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 *local_568;
  undefined8 *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 *local_4d8;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_cf0 = (float *)(in_RSI + 0x10);
  local_ce0 = &local_ec8;
  local_cb4 = *local_cf0;
  local_cb0 = &local_d08;
  local_488 = CONCAT44(local_cb4,local_cb4);
  uStack_480 = CONCAT44(local_cb4,local_cb4);
  local_cc4 = *(float *)(in_RSI + 0x14);
  local_cc0 = &local_d28;
  local_468 = CONCAT44(local_cc4,local_cc4);
  uStack_460 = CONCAT44(local_cc4,local_cc4);
  local_b88 = in_RDX + 2;
  local_cd4 = *(float *)(in_RSI + 0x18);
  local_cd0 = &local_d48;
  local_448 = CONCAT44(local_cd4,local_cd4);
  uStack_440 = CONCAT44(local_cd4,local_cd4);
  local_b18 = in_RDX + 4;
  local_b20 = in_RDX + 6;
  local_b90 = &local_d38;
  local_af8 = &local_b38;
  uVar1 = *local_b18;
  uVar2 = in_RDX[5];
  local_458._0_4_ = (float)uVar1;
  local_458._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_450._0_4_ = (float)uVar2;
  uStack_450._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_518 = local_cd4 * (float)local_458;
  fStack_514 = local_cd4 * local_458._4_4_;
  fStack_510 = local_cd4 * (float)uStack_450;
  fStack_50c = local_cd4 * uStack_450._4_4_;
  local_68 = CONCAT44(fStack_514,local_518);
  uStack_60 = CONCAT44(fStack_50c,fStack_510);
  uVar3 = *local_b20;
  uVar4 = in_RDX[7];
  local_78._0_4_ = (float)uVar3;
  local_78._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_70._0_4_ = (float)uVar4;
  uStack_70._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_ae8 = local_518 + (float)local_78;
  fStack_ae4 = fStack_514 + local_78._4_4_;
  fStack_ae0 = fStack_510 + (float)uStack_70;
  fStack_adc = fStack_50c + uStack_70._4_4_;
  local_c00 = &local_d18;
  local_b68 = &local_ba8;
  uVar5 = *local_b88;
  uVar6 = in_RDX[3];
  local_478._0_4_ = (float)uVar5;
  local_478._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_470._0_4_ = (float)uVar6;
  uStack_470._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_4e8 = local_cc4 * (float)local_478;
  fStack_4e4 = local_cc4 * local_478._4_4_;
  fStack_4e0 = local_cc4 * (float)uStack_470;
  fStack_4dc = local_cc4 * uStack_470._4_4_;
  local_48 = CONCAT44(fStack_4e4,local_4e8);
  uStack_40 = CONCAT44(fStack_4dc,fStack_4e0);
  local_58 = (float)local_d38;
  fStack_54 = (float)((ulong)local_d38 >> 0x20);
  fStack_50 = (float)uStack_d30;
  fStack_4c = (float)((ulong)uStack_d30 >> 0x20);
  local_b58 = local_4e8 + local_58;
  fStack_b54 = fStack_4e4 + fStack_54;
  fStack_b50 = fStack_4e0 + fStack_50;
  fStack_b4c = fStack_4dc + fStack_4c;
  local_bd8 = &local_c18;
  uVar7 = *in_RDX;
  uVar8 = in_RDX[1];
  local_498._0_4_ = (float)uVar7;
  local_498._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_490._0_4_ = (float)uVar8;
  uStack_490._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_4b8 = local_cb4 * (float)local_498;
  fStack_4b4 = local_cb4 * local_498._4_4_;
  fStack_4b0 = local_cb4 * (float)uStack_490;
  fStack_4ac = local_cb4 * uStack_490._4_4_;
  local_28 = CONCAT44(fStack_4b4,local_4b8);
  uStack_20 = CONCAT44(fStack_4ac,fStack_4b0);
  local_38 = (float)local_d18;
  fStack_34 = (float)((ulong)local_d18 >> 0x20);
  fStack_30 = (float)uStack_d10;
  fStack_2c = (float)((ulong)uStack_d10 >> 0x20);
  local_bc8 = local_4b8 + local_38;
  fStack_bc4 = fStack_4b4 + fStack_34;
  fStack_bc0 = fStack_4b0 + fStack_30;
  fStack_bbc = fStack_4ac + fStack_2c;
  local_ec8 = CONCAT44(fStack_bc4,local_bc8);
  uStack_ec0 = CONCAT44(fStack_bbc,fStack_bc0);
  local_d60 = (float *)(in_RSI + 0x20);
  local_d50 = &local_ed8;
  local_c84 = *local_d60;
  local_c80 = &local_d78;
  local_428 = CONCAT44(local_c84,local_c84);
  uStack_420 = CONCAT44(local_c84,local_c84);
  local_c94 = *(float *)(in_RSI + 0x24);
  local_c90 = &local_d98;
  local_408 = CONCAT44(local_c94,local_c94);
  uStack_400 = CONCAT44(local_c94,local_c94);
  local_a38 = in_RDX + 2;
  local_ca4 = *(float *)(in_RSI + 0x28);
  local_ca0 = &local_db8;
  local_3e8 = CONCAT44(local_ca4,local_ca4);
  uStack_3e0 = CONCAT44(local_ca4,local_ca4);
  local_9c8 = in_RDX + 4;
  local_9d0 = in_RDX + 6;
  local_a40 = &local_da8;
  local_9a8 = &local_9e8;
  uVar9 = *local_9c8;
  uVar10 = in_RDX[5];
  local_3f8._0_4_ = (float)uVar9;
  local_3f8._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_3f0._0_4_ = (float)uVar10;
  uStack_3f0._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_5a8 = local_ca4 * (float)local_3f8;
  fStack_5a4 = local_ca4 * local_3f8._4_4_;
  fStack_5a0 = local_ca4 * (float)uStack_3f0;
  fStack_59c = local_ca4 * uStack_3f0._4_4_;
  local_c8 = CONCAT44(fStack_5a4,local_5a8);
  uStack_c0 = CONCAT44(fStack_59c,fStack_5a0);
  uVar11 = *local_9d0;
  uVar12 = in_RDX[7];
  local_d8._0_4_ = (float)uVar11;
  local_d8._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_d0._0_4_ = (float)uVar12;
  uStack_d0._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_998 = local_5a8 + (float)local_d8;
  fStack_994 = fStack_5a4 + local_d8._4_4_;
  fStack_990 = fStack_5a0 + (float)uStack_d0;
  fStack_98c = fStack_59c + uStack_d0._4_4_;
  local_ab0 = &local_d88;
  local_a18 = &local_a58;
  uVar13 = *local_a38;
  uVar14 = in_RDX[3];
  local_418._0_4_ = (float)uVar13;
  local_418._4_4_ = (float)((ulong)uVar13 >> 0x20);
  uStack_410._0_4_ = (float)uVar14;
  uStack_410._4_4_ = (float)((ulong)uVar14 >> 0x20);
  local_578 = local_c94 * (float)local_418;
  fStack_574 = local_c94 * local_418._4_4_;
  fStack_570 = local_c94 * (float)uStack_410;
  fStack_56c = local_c94 * uStack_410._4_4_;
  local_a8 = CONCAT44(fStack_574,local_578);
  uStack_a0 = CONCAT44(fStack_56c,fStack_570);
  local_b8 = (float)local_da8;
  fStack_b4 = (float)((ulong)local_da8 >> 0x20);
  fStack_b0 = (float)uStack_da0;
  fStack_ac = (float)((ulong)uStack_da0 >> 0x20);
  local_a08 = local_578 + local_b8;
  fStack_a04 = fStack_574 + fStack_b4;
  fStack_a00 = fStack_570 + fStack_b0;
  fStack_9fc = fStack_56c + fStack_ac;
  local_a88 = &local_ac8;
  uVar15 = *in_RDX;
  uVar16 = in_RDX[1];
  local_438._0_4_ = (float)uVar15;
  local_438._4_4_ = (float)((ulong)uVar15 >> 0x20);
  uStack_430._0_4_ = (float)uVar16;
  uStack_430._4_4_ = (float)((ulong)uVar16 >> 0x20);
  local_548 = local_c84 * (float)local_438;
  fStack_544 = local_c84 * local_438._4_4_;
  fStack_540 = local_c84 * (float)uStack_430;
  fStack_53c = local_c84 * uStack_430._4_4_;
  local_88 = CONCAT44(fStack_544,local_548);
  uStack_80 = CONCAT44(fStack_53c,fStack_540);
  local_98 = (float)local_d88;
  fStack_94 = (float)((ulong)local_d88 >> 0x20);
  fStack_90 = (float)uStack_d80;
  fStack_8c = (float)((ulong)uStack_d80 >> 0x20);
  local_a78 = local_548 + local_98;
  fStack_a74 = fStack_544 + fStack_94;
  fStack_a70 = fStack_540 + fStack_90;
  fStack_a6c = fStack_53c + fStack_8c;
  local_ed8 = CONCAT44(fStack_a74,local_a78);
  uStack_ed0 = CONCAT44(fStack_a6c,fStack_a70);
  local_dd0 = (float *)(in_RSI + 0x30);
  local_dc0 = &stack0xfffffffffffff118;
  local_c54 = *local_dd0;
  local_c50 = &local_de8;
  local_3c8 = CONCAT44(local_c54,local_c54);
  uStack_3c0 = CONCAT44(local_c54,local_c54);
  local_c64 = *(float *)(in_RSI + 0x34);
  local_c60 = &local_e08;
  local_3a8 = CONCAT44(local_c64,local_c64);
  uStack_3a0 = CONCAT44(local_c64,local_c64);
  local_8e8 = in_RDX + 2;
  local_c74 = *(float *)(in_RSI + 0x38);
  local_c70 = &local_e28;
  local_388 = CONCAT44(local_c74,local_c74);
  uStack_380 = CONCAT44(local_c74,local_c74);
  local_878 = in_RDX + 4;
  local_880 = in_RDX + 6;
  local_8f0 = &local_e18;
  local_858 = &local_898;
  uVar17 = *local_878;
  uVar18 = in_RDX[5];
  local_398._0_4_ = (float)uVar17;
  local_398._4_4_ = (float)((ulong)uVar17 >> 0x20);
  uStack_390._0_4_ = (float)uVar18;
  uStack_390._4_4_ = (float)((ulong)uVar18 >> 0x20);
  local_638 = local_c74 * (float)local_398;
  fStack_634 = local_c74 * local_398._4_4_;
  fStack_630 = local_c74 * (float)uStack_390;
  fStack_62c = local_c74 * uStack_390._4_4_;
  local_128 = CONCAT44(fStack_634,local_638);
  uStack_120 = CONCAT44(fStack_62c,fStack_630);
  uVar19 = *local_880;
  uVar20 = in_RDX[7];
  local_138._0_4_ = (float)uVar19;
  local_138._4_4_ = (float)((ulong)uVar19 >> 0x20);
  uStack_130._0_4_ = (float)uVar20;
  uStack_130._4_4_ = (float)((ulong)uVar20 >> 0x20);
  local_848 = local_638 + (float)local_138;
  fStack_844 = fStack_634 + local_138._4_4_;
  fStack_840 = fStack_630 + (float)uStack_130;
  fStack_83c = fStack_62c + uStack_130._4_4_;
  local_960 = &local_df8;
  local_8c8 = &local_908;
  uVar21 = *local_8e8;
  uVar22 = in_RDX[3];
  local_3b8._0_4_ = (float)uVar21;
  local_3b8._4_4_ = (float)((ulong)uVar21 >> 0x20);
  uStack_3b0._0_4_ = (float)uVar22;
  uStack_3b0._4_4_ = (float)((ulong)uVar22 >> 0x20);
  local_608 = local_c64 * (float)local_3b8;
  fStack_604 = local_c64 * local_3b8._4_4_;
  fStack_600 = local_c64 * (float)uStack_3b0;
  fStack_5fc = local_c64 * uStack_3b0._4_4_;
  local_108 = CONCAT44(fStack_604,local_608);
  uStack_100 = CONCAT44(fStack_5fc,fStack_600);
  local_118 = (float)local_e18;
  fStack_114 = (float)((ulong)local_e18 >> 0x20);
  fStack_110 = (float)uStack_e10;
  fStack_10c = (float)((ulong)uStack_e10 >> 0x20);
  local_8b8 = local_608 + local_118;
  fStack_8b4 = fStack_604 + fStack_114;
  fStack_8b0 = fStack_600 + fStack_110;
  fStack_8ac = fStack_5fc + fStack_10c;
  local_938 = &local_978;
  uVar23 = *in_RDX;
  uVar24 = in_RDX[1];
  local_3d8._0_4_ = (float)uVar23;
  local_3d8._4_4_ = (float)((ulong)uVar23 >> 0x20);
  uStack_3d0._0_4_ = (float)uVar24;
  uStack_3d0._4_4_ = (float)((ulong)uVar24 >> 0x20);
  local_5d8 = local_c54 * (float)local_3d8;
  fStack_5d4 = local_c54 * local_3d8._4_4_;
  fStack_5d0 = local_c54 * (float)uStack_3d0;
  fStack_5cc = local_c54 * uStack_3d0._4_4_;
  local_e8 = CONCAT44(fStack_5d4,local_5d8);
  uStack_e0 = CONCAT44(fStack_5cc,fStack_5d0);
  local_f8 = (float)local_df8;
  fStack_f4 = (float)((ulong)local_df8 >> 0x20);
  fStack_f0 = (float)uStack_df0;
  fStack_ec = (float)((ulong)uStack_df0 >> 0x20);
  local_928 = local_5d8 + local_f8;
  fStack_924 = fStack_5d4 + fStack_f4;
  fStack_920 = fStack_5d0 + fStack_f0;
  fStack_91c = fStack_5cc + fStack_ec;
  local_e40 = (float *)(in_RSI + 0x40);
  local_e30 = &stack0xfffffffffffff108;
  local_c24 = *local_e40;
  local_c20 = &local_e58;
  local_368 = CONCAT44(local_c24,local_c24);
  uStack_360 = CONCAT44(local_c24,local_c24);
  local_c34 = *(float *)(in_RSI + 0x44);
  local_c30 = &local_e78;
  local_348 = CONCAT44(local_c34,local_c34);
  uStack_340 = CONCAT44(local_c34,local_c34);
  local_798 = in_RDX + 2;
  local_c44 = *(float *)(in_RSI + 0x48);
  local_c40 = &local_e98;
  local_328 = CONCAT44(local_c44,local_c44);
  uStack_320 = CONCAT44(local_c44,local_c44);
  local_728 = in_RDX + 4;
  local_730 = in_RDX + 6;
  local_718 = &local_e88;
  local_720 = &local_e98;
  local_6d0 = &local_748;
  uVar25 = *local_728;
  uVar26 = in_RDX[5];
  local_338._0_4_ = (float)uVar25;
  local_338._4_4_ = (float)((ulong)uVar25 >> 0x20);
  uStack_330._0_4_ = (float)uVar26;
  uStack_330._4_4_ = (float)((ulong)uVar26 >> 0x20);
  local_6c8 = local_c44 * (float)local_338;
  fStack_6c4 = local_c44 * local_338._4_4_;
  fStack_6c0 = local_c44 * (float)uStack_330;
  fStack_6bc = local_c44 * uStack_330._4_4_;
  local_6b8 = &local_748;
  local_188 = CONCAT44(fStack_6c4,local_6c8);
  uStack_180 = CONCAT44(fStack_6bc,fStack_6c0);
  local_700 = &local_e88;
  local_708 = &local_748;
  uVar27 = *local_730;
  uVar28 = in_RDX[7];
  local_198._0_4_ = (float)uVar27;
  local_198._4_4_ = (float)((ulong)uVar27 >> 0x20);
  uStack_190._0_4_ = (float)uVar28;
  uStack_190._4_4_ = (float)((ulong)uVar28 >> 0x20);
  local_6f8 = local_6c8 + (float)local_198;
  fStack_6f4 = fStack_6c4 + local_198._4_4_;
  fStack_6f0 = fStack_6c0 + (float)uStack_190;
  fStack_6ec = fStack_6bc + uStack_190._4_4_;
  local_6e8 = &local_e88;
  local_788 = &local_e68;
  local_790 = &local_e78;
  local_7a0 = &local_e88;
  local_6a0 = &local_7b8;
  uVar29 = *local_798;
  uVar30 = in_RDX[3];
  local_358._0_4_ = (float)uVar29;
  local_358._4_4_ = (float)((ulong)uVar29 >> 0x20);
  uStack_350._0_4_ = (float)uVar30;
  uStack_350._4_4_ = (float)((ulong)uVar30 >> 0x20);
  local_698 = local_c34 * (float)local_358;
  fStack_694 = local_c34 * local_358._4_4_;
  fStack_690 = local_c34 * (float)uStack_350;
  fStack_68c = local_c34 * uStack_350._4_4_;
  local_688 = &local_7b8;
  local_168 = CONCAT44(fStack_694,local_698);
  uStack_160 = CONCAT44(fStack_68c,fStack_690);
  local_770 = &local_e68;
  local_778 = &local_7b8;
  local_178 = (float)local_e88;
  fStack_174 = (float)((ulong)local_e88 >> 0x20);
  fStack_170 = (float)uStack_e80;
  fStack_16c = (float)((ulong)uStack_e80 >> 0x20);
  local_768 = local_698 + local_178;
  fStack_764 = fStack_694 + fStack_174;
  fStack_760 = fStack_690 + fStack_170;
  fStack_75c = fStack_68c + fStack_16c;
  local_750 = &local_e68;
  local_7f8 = &stack0xfffffffffffff108;
  local_800 = &local_e58;
  local_810 = &local_e68;
  local_670 = &local_828;
  uVar31 = *in_RDX;
  uVar32 = in_RDX[1];
  local_378._0_4_ = (float)uVar31;
  local_378._4_4_ = (float)((ulong)uVar31 >> 0x20);
  uStack_370._0_4_ = (float)uVar32;
  uStack_370._4_4_ = (float)((ulong)uVar32 >> 0x20);
  local_668 = local_c24 * (float)local_378;
  fStack_664 = local_c24 * local_378._4_4_;
  fStack_660 = local_c24 * (float)uStack_370;
  fStack_65c = local_c24 * uStack_370._4_4_;
  local_658 = &local_828;
  local_148 = CONCAT44(fStack_664,local_668);
  uStack_140 = CONCAT44(fStack_65c,fStack_660);
  local_7e0 = &stack0xfffffffffffff108;
  local_7e8 = &local_828;
  local_158 = (float)local_e68;
  fStack_154 = (float)((ulong)local_e68 >> 0x20);
  fStack_150 = (float)uStack_e60;
  fStack_14c = (float)((ulong)uStack_e60 >> 0x20);
  local_7d8 = local_668 + local_158;
  fStack_7d4 = fStack_664 + fStack_154;
  fStack_7d0 = fStack_660 + fStack_150;
  fStack_7cc = fStack_65c + fStack_14c;
  local_7c0 = &stack0xfffffffffffff108;
  local_bf0 = local_cb0;
  local_be8 = local_ce0;
  local_be0 = local_c00;
  local_bd0 = local_ce0;
  local_bb0 = local_ce0;
  local_b80 = local_cc0;
  local_b78 = local_c00;
  local_b70 = local_b90;
  local_b60 = local_c00;
  local_b40 = local_c00;
  local_b10 = local_cd0;
  local_b08 = local_b90;
  local_b00 = local_b20;
  local_af0 = local_b90;
  local_ad0 = local_b90;
  local_aa0 = local_c80;
  local_a98 = local_d50;
  local_a90 = local_ab0;
  local_a80 = local_d50;
  local_a60 = local_d50;
  local_a30 = local_c90;
  local_a28 = local_ab0;
  local_a20 = local_a40;
  local_a10 = local_ab0;
  local_9f0 = local_ab0;
  local_9c0 = local_ca0;
  local_9b8 = local_a40;
  local_9b0 = local_9d0;
  local_9a0 = local_a40;
  local_980 = local_a40;
  local_950 = local_c50;
  local_948 = local_dc0;
  local_940 = local_960;
  local_930 = local_dc0;
  local_910 = local_dc0;
  local_8e0 = local_c60;
  local_8d8 = local_960;
  local_8d0 = local_8f0;
  local_8c0 = local_960;
  local_8a0 = local_960;
  local_870 = local_c70;
  local_868 = local_8f0;
  local_860 = local_880;
  local_850 = local_8f0;
  local_830 = local_8f0;
  local_7f0 = local_810;
  local_780 = local_7a0;
  local_710 = local_730;
  local_6e0 = local_728;
  local_6d8 = local_720;
  local_6b0 = local_798;
  local_6a8 = local_790;
  local_678 = local_800;
  local_650 = local_878;
  local_648 = local_c70;
  local_640 = local_858;
  local_628 = local_858;
  local_620 = local_8e8;
  local_618 = local_c60;
  local_610 = local_8c8;
  local_5f8 = local_8c8;
  local_5e8 = local_c50;
  local_5e0 = local_938;
  local_5c8 = local_938;
  local_5c0 = local_9c8;
  local_5b8 = local_ca0;
  local_5b0 = local_9a8;
  local_598 = local_9a8;
  local_590 = local_a38;
  local_588 = local_c90;
  local_580 = local_a18;
  local_568 = local_a18;
  local_558 = local_c80;
  local_550 = local_a88;
  local_538 = local_a88;
  local_530 = local_b18;
  local_528 = local_cd0;
  local_520 = local_af8;
  local_508 = local_af8;
  local_500 = local_b88;
  local_4f8 = local_cc0;
  local_4f0 = local_b68;
  local_4d8 = local_b68;
  local_4c8 = local_cb0;
  local_4c0 = local_bd8;
  local_4a0 = local_bd8;
  local_498 = uVar7;
  uStack_490 = uVar8;
  local_478 = uVar5;
  uStack_470 = uVar6;
  local_458 = uVar1;
  uStack_450 = uVar2;
  local_438 = uVar15;
  uStack_430 = uVar16;
  local_418 = uVar13;
  uStack_410 = uVar14;
  local_3f8 = uVar9;
  uStack_3f0 = uVar10;
  local_3d8 = uVar23;
  uStack_3d0 = uVar24;
  local_3b8 = uVar21;
  uStack_3b0 = uVar22;
  local_398 = uVar17;
  uStack_390 = uVar18;
  local_378 = uVar31;
  uStack_370 = uVar32;
  local_358 = uVar29;
  uStack_350 = uVar30;
  local_338 = uVar25;
  uStack_330 = uVar26;
  local_318 = local_c24;
  fStack_314 = local_c24;
  fStack_310 = local_c24;
  fStack_30c = local_c24;
  local_2fc = local_c24;
  local_2f8 = local_c34;
  fStack_2f4 = local_c34;
  fStack_2f0 = local_c34;
  fStack_2ec = local_c34;
  local_2dc = local_c34;
  local_2d8 = local_c44;
  fStack_2d4 = local_c44;
  fStack_2d0 = local_c44;
  fStack_2cc = local_c44;
  local_2c8 = local_c44;
  local_2b8 = local_c54;
  fStack_2b4 = local_c54;
  fStack_2b0 = local_c54;
  fStack_2ac = local_c54;
  local_29c = local_c54;
  local_298 = local_c64;
  fStack_294 = local_c64;
  fStack_290 = local_c64;
  fStack_28c = local_c64;
  local_27c = local_c64;
  local_278 = local_c74;
  fStack_274 = local_c74;
  fStack_270 = local_c74;
  fStack_26c = local_c74;
  local_25c = local_c74;
  local_258 = local_c84;
  fStack_254 = local_c84;
  fStack_250 = local_c84;
  fStack_24c = local_c84;
  local_23c = local_c84;
  local_238 = local_c94;
  fStack_234 = local_c94;
  fStack_230 = local_c94;
  fStack_22c = local_c94;
  local_21c = local_c94;
  local_218 = local_ca4;
  fStack_214 = local_ca4;
  fStack_210 = local_ca4;
  fStack_20c = local_ca4;
  local_1fc = local_ca4;
  local_1f8 = local_cb4;
  fStack_1f4 = local_cb4;
  fStack_1f0 = local_cb4;
  fStack_1ec = local_cb4;
  local_1dc = local_cb4;
  local_1d8 = local_cc4;
  fStack_1d4 = local_cc4;
  fStack_1d0 = local_cc4;
  fStack_1cc = local_cc4;
  local_1bc = local_cc4;
  local_1b8 = local_cd4;
  fStack_1b4 = local_cd4;
  fStack_1b0 = local_cd4;
  fStack_1ac = local_cd4;
  local_19c = local_cd4;
  local_198 = uVar27;
  uStack_190 = uVar28;
  local_138 = uVar19;
  uStack_130 = uVar20;
  local_d8 = uVar11;
  uStack_d0 = uVar12;
  local_78 = uVar3;
  uStack_70 = uVar4;
  local_e98 = local_328;
  uStack_e90 = uStack_320;
  local_e88 = CONCAT44(fStack_6f4,local_6f8);
  uStack_e80 = CONCAT44(fStack_6ec,fStack_6f0);
  local_e78 = local_348;
  uStack_e70 = uStack_340;
  local_e68 = CONCAT44(fStack_764,local_768);
  uStack_e60 = CONCAT44(fStack_75c,fStack_760);
  local_e58 = local_368;
  uStack_e50 = uStack_360;
  local_e28 = local_388;
  uStack_e20 = uStack_380;
  local_e18 = CONCAT44(fStack_844,local_848);
  uStack_e10 = CONCAT44(fStack_83c,fStack_840);
  local_e08 = local_3a8;
  uStack_e00 = uStack_3a0;
  local_df8 = CONCAT44(fStack_8b4,local_8b8);
  uStack_df0 = CONCAT44(fStack_8ac,fStack_8b0);
  local_de8 = local_3c8;
  uStack_de0 = uStack_3c0;
  local_db8 = local_3e8;
  uStack_db0 = uStack_3e0;
  local_da8 = CONCAT44(fStack_994,local_998);
  uStack_da0 = CONCAT44(fStack_98c,fStack_990);
  local_d98 = local_408;
  uStack_d90 = uStack_400;
  local_d88 = CONCAT44(fStack_a04,local_a08);
  uStack_d80 = CONCAT44(fStack_9fc,fStack_a00);
  local_d78 = local_428;
  uStack_d70 = uStack_420;
  local_d48 = local_448;
  uStack_d40 = uStack_440;
  local_d38 = CONCAT44(fStack_ae4,local_ae8);
  uStack_d30 = CONCAT44(fStack_adc,fStack_ae0);
  local_d28 = local_468;
  uStack_d20 = uStack_460;
  local_d18 = CONCAT44(fStack_b54,local_b58);
  uStack_d10 = CONCAT44(fStack_b4c,fStack_b50);
  local_d08 = local_488;
  uStack_d00 = uStack_480;
  local_c18 = local_28;
  uStack_c10 = uStack_20;
  local_ba8 = local_48;
  uStack_ba0 = uStack_40;
  local_b38 = local_68;
  uStack_b30 = uStack_60;
  local_ac8 = local_88;
  uStack_ac0 = uStack_80;
  local_a58 = local_a8;
  uStack_a50 = uStack_a0;
  local_9e8 = local_c8;
  uStack_9e0 = uStack_c0;
  local_978 = local_e8;
  uStack_970 = uStack_e0;
  local_908 = local_108;
  uStack_900 = uStack_100;
  local_898 = local_128;
  uStack_890 = uStack_120;
  local_828 = local_148;
  uStack_820 = uStack_140;
  local_7b8 = local_168;
  uStack_7b0 = uStack_160;
  local_748 = local_188;
  uStack_740 = uStack_180;
  QuadLight((QuadLight *)CONCAT44(fStack_91c,fStack_920),(Vec3fa *)CONCAT44(fStack_924,local_928),
            (Vec3fa *)CONCAT44(fStack_7cc,fStack_7d0),(Vec3fa *)CONCAT44(fStack_7d4,local_7d8),
            (Vec3fa *)in_RDI,in_stack_fffffffffffff0f8);
  return in_RDI;
}

Assistant:

QuadLight transform(const AffineSpace3fa& space) const {
        return QuadLight(xfmPoint(space,v0),xfmPoint(space,v1),xfmPoint(space,v2),xfmPoint(space,v3),L);
      }